

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DualStringMappedVector.hpp
# Opt level: O0

__normal_iterator<helics::BasicBrokerInfo_*,_std::vector<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>_>
 __thiscall
gmlc::containers::
DualStringMappedVector<helics::BasicBrokerInfo,_helics::GlobalBrokerId,_(reference_stability)1,_5>::
find(DualStringMappedVector<helics::BasicBrokerInfo,_helics::GlobalBrokerId,_(reference_stability)1,_5>
     *this,GlobalBrokerId *searchValue)

{
  bool bVar1;
  _Node_iterator_base<std::pair<const_helics::GlobalBrokerId,_unsigned_long>,_false> this_00;
  iterator __n;
  unordered_map<helics::GlobalBrokerId,_unsigned_long,_std::hash<helics::GlobalBrokerId>,_std::equal_to<helics::GlobalBrokerId>,_std::allocator<std::pair<const_helics::GlobalBrokerId,_unsigned_long>_>_>
  *in_RDI;
  iterator fnd;
  _Node_iterator_base<std::pair<const_helics::GlobalBrokerId,_unsigned_long>,_false> local_20 [3];
  BasicBrokerInfo *local_8;
  
  local_20[0]._M_cur =
       (__node_type *)
       CLI::std::
       unordered_map<helics::GlobalBrokerId,_unsigned_long,_std::hash<helics::GlobalBrokerId>,_std::equal_to<helics::GlobalBrokerId>,_std::allocator<std::pair<const_helics::GlobalBrokerId,_unsigned_long>_>_>
       ::find(in_RDI,(key_type *)0x61c3a8);
  this_00._M_cur =
       (__node_type *)
       CLI::std::
       unordered_map<helics::GlobalBrokerId,_unsigned_long,_std::hash<helics::GlobalBrokerId>,_std::equal_to<helics::GlobalBrokerId>,_std::allocator<std::pair<const_helics::GlobalBrokerId,_unsigned_long>_>_>
       ::end(in_RDI);
  bVar1 = CLI::std::__detail::operator==
                    (local_20,(_Node_iterator_base<std::pair<const_helics::GlobalBrokerId,_unsigned_long>,_false>
                               *)&stack0xffffffffffffffd8);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    local_8 = (BasicBrokerInfo *)
              CLI::std::vector<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>::
              end((vector<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_> *)
                  in_RDI);
  }
  else {
    __n = CLI::std::vector<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>::begin
                    ((vector<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_> *)
                     in_RDI);
    CLI::std::__detail::
    _Node_iterator<std::pair<const_helics::GlobalBrokerId,_unsigned_long>,_false,_false>::operator->
              ((_Node_iterator<std::pair<const_helics::GlobalBrokerId,_unsigned_long>,_false,_false>
                *)0x61c3f1);
    local_8 = (BasicBrokerInfo *)
              __gnu_cxx::
              __normal_iterator<helics::BasicBrokerInfo_*,_std::vector<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>_>
              ::operator+((__normal_iterator<helics::BasicBrokerInfo_*,_std::vector<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>_>
                           *)this_00._M_cur,__n._M_current);
  }
  return (__normal_iterator<helics::BasicBrokerInfo_*,_std::vector<helics::BasicBrokerInfo,_std::allocator<helics::BasicBrokerInfo>_>_>
          )local_8;
}

Assistant:

auto find(const searchType2& searchValue)
        {
            auto fnd = lookup2.find(searchValue);
            if (fnd != lookup2.end()) {
                return dataStorage.begin() + fnd->second;
            }
            return dataStorage.end();
        }